

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void google::protobuf::internal::PrintAllCounters(void)

{
  FILE *output;
  Map *pMVar1;
  _Rb_tree_node_base *p_Var2;
  Data *pDVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  size_t sVar6;
  char *pcVar7;
  _Base_ptr *pp_Var8;
  long lVar9;
  long lVar10;
  iterator __begin3;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  UntypedFormatSpecImpl format_02;
  UntypedFormatSpecImpl format_03;
  UntypedFormatSpecImpl format_04;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_02;
  Data local_80;
  code *local_78;
  long local_70;
  code *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  Data local_50;
  double local_48;
  double dStack_40;
  
  pMVar1 = CounterMap();
  if ((pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    format.size_ = 0x19;
    format.data_ = "Protobuf debug counters:\n";
    absl::lts_20250127::str_format_internal::FprintF
              (_stderr,format,
               (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)ZEXT816(0));
    p_Var5 = (pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = &(pMVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var5 != local_58) {
      do {
        local_80.ptr = p_Var5 + 1;
        local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                   Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        format_00.size_ = 9;
        format_00.data_ = "  %-12s:\n";
        args.len_ = 1;
        args.ptr_ = (pointer)&local_80;
        absl::lts_20250127::str_format_internal::FprintF(_stderr,format_00,args);
        pp_Var8 = &p_Var5[1]._M_right;
        lVar9 = 0;
        p_Var4 = p_Var5[2]._M_parent;
        local_60 = p_Var5;
        for (p_Var2 = p_Var4; p_Var2 != (_Rb_tree_node_base *)pp_Var8;
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
          for (p_Var5 = p_Var2[1]._M_right; p_Var5 != *(_Base_ptr *)(p_Var2 + 2);
              p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
            lVar9 = lVar9 + **(long **)p_Var5;
          }
        }
        if (p_Var4 != (_Rb_tree_node_base *)pp_Var8) {
          auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar11._0_8_ = lVar9;
          auVar11._12_4_ = 0x45300000;
          dStack_40 = auVar11._8_8_ - 1.9342813113834067e+25;
          local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
          do {
            output = _stderr;
            lVar10 = 0;
            for (p_Var5 = p_Var4[1]._M_right; p_Var5 != *(_Base_ptr *)(p_Var4 + 2);
                p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
              lVar10 = lVar10 + **(long **)p_Var5;
            }
            if (*(char *)&p_Var4[1]._M_left == '\0') {
              pDVar3 = (Data *)std::
                               get<0ul,long,std::basic_string_view<char,std::char_traits<char>>>
                                         ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                           *)(p_Var4 + 1));
              local_80 = *pDVar3;
              local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<long>;
              sVar6 = 0xf;
              pcVar7 = "    %9d : %10zu";
            }
            else {
              local_80.ptr = std::get<1ul,long,std::basic_string_view<char,std::char_traits<char>>>
                                       ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)(p_Var4 + 1));
              local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
              sVar6 = 0x10;
              pcVar7 = "    %-10s: %10zu";
            }
            local_68 = absl::lts_20250127::str_format_internal::FormatArgImpl::
                       Dispatch<unsigned_long>;
            format_01.size_ = sVar6;
            format_01.data_ = pcVar7;
            args_00.len_ = 2;
            args_00.ptr_ = (pointer)&local_80;
            local_70 = lVar10;
            absl::lts_20250127::str_format_internal::FprintF(output,format_01,args_00);
            if ((lVar9 != 0) && ((_Base_ptr)0x1 < local_60[2]._M_right)) {
              auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar12._0_8_ = lVar10;
              auVar12._12_4_ = 0x45300000;
              local_80 = (Data)((((auVar12._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) *
                                100.0) / local_48);
              local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
              format_02.size_ = 10;
              format_02.data_ = " (%5.2f%%)";
              args_01.len_ = 1;
              args_01.ptr_ = (pointer)&local_80;
              local_50 = local_80;
              absl::lts_20250127::str_format_internal::FprintF(_stderr,format_02,args_01);
            }
            format_03.size_ = 1;
            format_03.data_ = "\n";
            absl::lts_20250127::str_format_internal::FprintF
                      (_stderr,format_03,
                       (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)
                       ZEXT816(0));
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          } while (p_Var4 != (_Rb_tree_node_base *)pp_Var8);
        }
        p_Var5 = local_60;
        if ((lVar9 != 0) && ((_Base_ptr)0x1 < local_60[2]._M_right)) {
          local_80.ptr = "Total";
          local_78 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<char_const*>;
          local_68 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          ;
          format_04.size_ = 0x11;
          format_04.data_ = "    %-10s: %10zu\n";
          args_02.len_ = 2;
          args_02.ptr_ = (pointer)&local_80;
          local_70 = lVar9;
          absl::lts_20250127::str_format_internal::FprintF(_stderr,format_04,args_02);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_58);
    }
  }
  return;
}

Assistant:

static void PrintAllCounters() {
  auto& counters = CounterMap();
  if (counters.empty()) return;
  absl::FPrintF(stderr, "Protobuf debug counters:\n");
  for (auto& [category_name, category_map] : counters) {
    // Example output:
    //
    //   Category  :
    //     Value 1 : 1234 (12.34%)
    //     Value 2 : 2345 (23.45%)
    //     Total   : 3579
    absl::FPrintF(stderr, "  %-12s:\n", category_name);
    size_t total = 0;
    for (auto& entry : category_map) {
      for (auto* counter : entry.second) {
        total += counter->value();
      }
    }
    for (auto& [subname, counter_vector] : category_map) {
      size_t value = 0;
      for (auto* counter : counter_vector) {
        value += counter->value();
      }
      if (std::holds_alternative<int64_t>(subname)) {
        // For integers, right align
        absl::FPrintF(stderr, "    %9d : %10zu", std::get<int64_t>(subname),
                      value);
      } else {
        // For strings, left align
        absl::FPrintF(stderr, "    %-10s: %10zu",
                      std::get<absl::string_view>(subname), value);
      }
      if (total != 0 && category_map.size() > 1) {
        absl::FPrintF(
            stderr, " (%5.2f%%)",
            100. * static_cast<double>(value) / static_cast<double>(total));
      }
      absl::FPrintF(stderr, "\n");
    }
    if (total != 0 && category_map.size() > 1) {
      absl::FPrintF(stderr, "    %-10s: %10zu\n", "Total", total);
    }
  }
}